

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O0

void up_box(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  if ((w < 9) || (h < 9)) {
    thin_up_box(x,y,w,h,c);
  }
  else {
    shade_rect(x + 1,y + 1,w + -2,h + -3,"RVQNOPQRSTUVWVQ",c);
    frame_rect(x,y,w,h + -1,"IJLM",c);
  }
  return;
}

Assistant:

static void up_box(int x, int y, int w, int h, Fl_Color c) {
#ifdef USE_OLD_PLASTIC_BOX
  shade_rect(x + 2, y + 2, w - 4, h - 5, "RVQNOPQRSTUVWVQ", c);
  up_frame(x, y, w, h, c);
#else
  if (w > 8 && h > 8) {
    shade_rect(x + 1, y + 1, w - 2, h - 3, "RVQNOPQRSTUVWVQ", c);
    frame_rect(x, y, w, h - 1, "IJLM", c);
  } else {
    thin_up_box(x, y, w, h, c);
  }
#endif // USE_OLD_PLASTIC_BOX
}